

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  uint *p_00;
  archive_string *as;
  archive_string *as_00;
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  void *pvVar7;
  void *__src;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  void *__dest;
  time_t tVar13;
  ulong *puVar14;
  bool bVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  
  pvVar6 = a->format->data;
  as = &file->symlink;
  as_00 = &file->name;
  bVar15 = true;
  for (; ((p_00 = (uint *)(p + 4), p_00 <= end && (bVar2 = *p, (byte)(bVar2 + 0xbf) < 0x1a)) &&
         (bVar3 = p[1], (byte)(bVar3 + 0xbf) < 0x1a)); p = p + p[2]) {
    bVar4 = p[2];
    if (((ulong)bVar4 < 4) || (end < p + bVar4)) break;
    uVar9 = bVar4 - 4;
    bVar5 = p[3];
    if (0xc < bVar2 - 0x4e) {
      if (bVar2 == 0x43) {
        if (bVar3 == 0x4c) {
          if (uVar9 == 8 && bVar5 == 1) {
            file->cl_offset = (ulong)*p_00 * *(long *)((long)pvVar6 + 0xa8);
            goto switchD_00123867_caseD_3;
          }
        }
        else if ((bVar3 == 0x45) && (uVar9 == 0x18 && bVar5 == 1)) {
          iVar11 = *(int *)(p + 4);
          uVar9 = *(uint *)(p + 0xc);
          file->ce_offset = uVar9;
          uVar10 = *(uint *)(p + 0x14);
          file->ce_size = uVar10;
          pvVar7 = a->format->data;
          uVar19 = (long)iVar11 * *(ulong *)((long)pvVar7 + 0xa8);
          if ((((file->mode & 0xf000) == 0x8000) && (file->offset <= uVar19)) ||
             (((uVar19 < *(ulong *)((long)pvVar7 + 0xa0) ||
               (uVar12 = (ulong)uVar10 + (ulong)uVar9, *(ulong *)((long)pvVar7 + 0xa8) < uVar12)) ||
              (*(ulong *)((long)pvVar7 + 0xb0) < uVar12 + uVar19)))) {
            pcVar17 = "Invalid parameter in SUSP \"CE\" extension";
            iVar11 = -1;
LAB_00124046:
            archive_set_error(&a->archive,iVar11,pcVar17);
            return -0x1e;
          }
          uVar9 = *(uint *)((long)pvVar7 + 0x40);
          iVar11 = *(int *)((long)pvVar7 + 0x44);
          if (iVar11 <= (int)uVar9) {
            uVar10 = iVar11 * 2;
            if (iVar11 < 0x10) {
              uVar10 = 0x10;
            }
            if (((int)uVar10 <= iVar11) ||
               (__dest = calloc((ulong)uVar10,0x10), __dest == (void *)0x0)) {
              pcVar17 = "Out of memory";
              iVar11 = 0xc;
              goto LAB_00124046;
            }
            __src = *(void **)((long)pvVar7 + 0x38);
            if (__src != (void *)0x0) {
              memcpy(__dest,__src,(long)(int)uVar9 << 4);
              free(__src);
              uVar9 = *(uint *)((long)pvVar7 + 0x40);
            }
            *(void **)((long)pvVar7 + 0x38) = __dest;
            *(uint *)((long)pvVar7 + 0x44) = uVar10;
          }
          *(uint *)((long)pvVar7 + 0x40) = uVar9 + 1;
          while (0 < (int)uVar9) {
            uVar10 = uVar9 - 1 >> 1;
            lVar8 = *(long *)((long)pvVar7 + 0x38);
            lVar16 = (ulong)uVar10 * 0x10;
            puVar1 = (ulong *)(lVar8 + (ulong)uVar9 * 0x10);
            if (*(ulong *)(lVar8 + lVar16) <= uVar19) {
              *puVar1 = uVar19;
              *(file_info **)(lVar8 + 8 + (ulong)uVar9 * 0x10) = file;
              goto switchD_00123818_caseD_4f;
            }
            puVar14 = (ulong *)(lVar8 + lVar16);
            uVar12 = puVar14[1];
            *puVar1 = *puVar14;
            puVar1[1] = uVar12;
            uVar9 = uVar10;
          }
          puVar1 = *(ulong **)((long)pvVar7 + 0x38);
          *puVar1 = uVar19;
          puVar1[1] = (ulong)file;
        }
      }
      goto switchD_00123818_caseD_4f;
    }
    uVar10 = (uint)bVar4;
    switch((uint)bVar2) {
    case 0x4e:
      if (bVar5 != 1 || bVar3 != 0x4d) break;
      if (file->name_continues == '\0') {
        (file->name).length = 0;
      }
      file->name_continues = '\0';
      if (bVar4 < 5) goto switchD_00123867_caseD_3;
      switch((byte)*p_00) {
      case 0:
        if (uVar9 != 1) {
          archive_strncat(as_00,p + 5,(ulong)(uVar10 - 5));
        }
        break;
      case 1:
        if (uVar9 != 1) {
          archive_strncat(as_00,p + 5,(ulong)(uVar10 - 5));
          file->name_continues = '\x01';
        }
        break;
      case 2:
        pcVar17 = ".";
        goto LAB_00123fd7;
      case 4:
        pcVar17 = "..";
LAB_00123fd7:
        archive_strcat(as_00,pcVar17);
      }
switchD_00123867_caseD_3:
      *(undefined1 *)((long)pvVar6 + 0x28) = 1;
      break;
    case 0x50:
      if (bVar3 == 0x4e) {
        if (uVar9 == 0x10 && bVar5 == 1) {
          uVar9 = toi(p_00,4);
          file->rdev = (ulong)uVar9 << 0x20;
          uVar10 = toi(p + 0xc,4);
          file->rdev = CONCAT44(uVar9,uVar10);
          goto switchD_00123867_caseD_3;
        }
      }
      else if (bVar5 == 1 && bVar3 == 0x58) {
        if (0xb < bVar4) {
          uVar9 = toi(p_00,4);
          file->mode = uVar9;
          if (0x13 < bVar4) {
            uVar9 = toi(p + 0xc,4);
            file->nlinks = uVar9;
            if (0x1b < bVar4) {
              uVar9 = toi(p + 0x14,4);
              file->uid = uVar9;
              if (0x23 < bVar4) {
                uVar9 = toi(p + 0x1c,4);
                file->gid = uVar9;
                if (0x2b < bVar4) {
                  uVar9 = toi(p + 0x24,4);
                  file->number = (ulong)uVar9;
                }
              }
            }
          }
        }
        goto switchD_00123867_caseD_3;
      }
      break;
    case 0x52:
      if (bVar5 == 1 && bVar3 == 0x45) {
        file->re = '\x01';
        *(undefined1 *)((long)pvVar6 + 0x28) = 1;
      }
      break;
    case 0x53:
      if (bVar3 == 0x4c) {
        if (bVar5 == 1) {
          if ((file->symlink_continues == '\0') || ((file->symlink).length == 0)) {
            (file->symlink).length = 0;
          }
          file->symlink_continues = '\0';
          if (4 < bVar4) {
            if ((byte)*p_00 != 0) {
              if ((byte)*p_00 != 1) goto switchD_00123b16_caseD_3;
              file->symlink_continues = '\x01';
            }
            pbVar20 = p + 5;
            pcVar17 = "";
            iVar11 = uVar10 - 5;
            while (1 < iVar11) {
              bVar2 = *pbVar20;
              bVar3 = pbVar20[1];
              pbVar20 = pbVar20 + 2;
              uVar9 = iVar11 - 2;
              archive_strcat(as,pcVar17);
              switch(bVar2) {
              case 0:
                if (bVar3 <= uVar9) {
                  archive_strncat(as,pbVar20,(ulong)(uint)bVar3);
                  goto LAB_00123bc3;
                }
                goto switchD_00123b16_caseD_3;
              case 1:
                if (bVar3 <= uVar9) {
                  archive_strncat(as,pbVar20,(ulong)bVar3);
                  goto LAB_00123b9c;
                }
                goto switchD_00123b16_caseD_3;
              case 2:
                pcVar17 = ".";
                break;
              case 3:
              case 5:
              case 6:
              case 7:
                goto switchD_00123b16_caseD_3;
              case 4:
                pcVar17 = "..";
                break;
              case 8:
                archive_strcat(as,"/");
LAB_00123b9c:
                pcVar17 = "";
                goto LAB_00123bca;
              default:
                if (bVar2 == 0x10) {
                  (file->symlink).length = 0;
                  pcVar17 = "ROOT";
                }
                else {
                  if (bVar2 != 0x20) goto switchD_00123b16_caseD_3;
                  pcVar17 = "hostname";
                }
              }
              archive_strcat(as,pcVar17);
LAB_00123bc3:
              pcVar17 = "/";
LAB_00123bca:
              pbVar20 = pbVar20 + bVar3;
              iVar11 = uVar9 - bVar3;
            }
          }
switchD_00123b16_caseD_3:
          *(undefined1 *)((long)pvVar6 + 0x28) = 1;
        }
      }
      else if (((bVar3 == 0x54) && (bVar4 == 4)) && (bVar5 == 1)) {
        *(undefined2 *)((long)pvVar6 + 0x28) = 0;
        return 0;
      }
      break;
    case 0x54:
      if (bVar5 == 1 && bVar3 == 0x46) {
        if (4 < bVar4) {
          bVar2 = p[4];
          pbVar20 = p + 5;
          uVar18 = bVar4 - 5;
          if ((char)bVar2 < '\0') {
            if (0x11 < uVar9 && (bVar2 & 1) != 0) {
              iVar11 = isodate17_valid(pbVar20);
              if (iVar11 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 1;
                tVar13 = isodate17(pbVar20);
                file->birthtime = tVar13;
              }
              pbVar20 = p + 0x16;
              uVar18 = uVar10 - 0x16;
            }
            if (((bVar2 & 2) != 0) && (0x10 < uVar18)) {
              iVar11 = isodate17_valid(pbVar20);
              if (iVar11 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 2;
                tVar13 = isodate17(pbVar20);
                file->mtime = tVar13;
              }
              pbVar20 = pbVar20 + 0x11;
              uVar18 = uVar18 - 0x11;
            }
            if (((bVar2 & 4) != 0) && (0x10 < uVar18)) {
              iVar11 = isodate17_valid(pbVar20);
              if (iVar11 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 4;
                tVar13 = isodate17(pbVar20);
                file->atime = tVar13;
              }
              pbVar20 = pbVar20 + 0x11;
              uVar18 = uVar18 - 0x11;
            }
            if ((((bVar2 & 8) != 0) && (0x10 < uVar18)) &&
               (iVar11 = isodate17_valid(pbVar20), iVar11 != 0)) {
              *(byte *)&file->time_is_set = (byte)file->time_is_set | 8;
              tVar13 = isodate17(pbVar20);
              goto LAB_00123f5b;
            }
          }
          else {
            if (7 < uVar9 && (bVar2 & 1) != 0) {
              iVar11 = isodate7_valid(pbVar20);
              if (iVar11 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 1;
                tVar13 = isodate7(pbVar20);
                file->birthtime = tVar13;
              }
              pbVar20 = p + 0xc;
              uVar18 = uVar10 - 0xc;
            }
            if (((bVar2 & 2) != 0) && (6 < uVar18)) {
              iVar11 = isodate7_valid(pbVar20);
              if (iVar11 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 2;
                tVar13 = isodate7(pbVar20);
                file->mtime = tVar13;
              }
              pbVar20 = pbVar20 + 7;
              uVar18 = uVar18 - 7;
            }
            if (((bVar2 & 4) != 0) && (6 < uVar18)) {
              iVar11 = isodate7_valid(pbVar20);
              if (iVar11 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 4;
                tVar13 = isodate7(pbVar20);
                file->atime = tVar13;
              }
              pbVar20 = pbVar20 + 7;
              uVar18 = uVar18 - 7;
            }
            if ((((bVar2 & 8) != 0) && (6 < uVar18)) &&
               (iVar11 = isodate7_valid(pbVar20), iVar11 != 0)) {
              *(byte *)&file->time_is_set = (byte)file->time_is_set | 8;
              tVar13 = isodate7(pbVar20);
LAB_00123f5b:
              file->ctime = tVar13;
            }
          }
        }
        goto switchD_00123867_caseD_3;
      }
      break;
    case 0x5a:
      if (((bVar5 == 1 && bVar3 == 0x46) && ((byte)*p_00 == 0x70)) &&
         ((uVar9 == 0xc && (p[5] == 0x7a)))) {
        file->pz = 1;
        file->pz_log2_bs = (uint)p[7];
        file->pz_uncompressed_size = (ulong)*(uint *)(p + 8);
      }
    }
switchD_00123818_caseD_4f:
    bVar15 = false;
  }
  iVar11 = 0;
  if (bVar15) {
    archive_set_error(&a->archive,0x54,"Tried to parse Rockridge extensions, but none found");
    iVar11 = -0x14;
  }
  return iVar11;
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;
	int entry_seen = 0;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = (__LA_MODE_T)toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
		entry_seen = 1;
	}

	if (entry_seen)
		return (ARCHIVE_OK);
	else {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Tried to parse Rockridge extensions, but none found");
		return (ARCHIVE_WARN);
	}
}